

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O2

string * formatBytes_abi_cxx11_(string *__return_storage_ptr__,size_t bytes)

{
  char *__format;
  double dVar1;
  undefined1 auVar2 [16];
  allocator<char> local_49;
  char formatted [24];
  string local_30;
  
  if (bytes < 995000000) {
    if (bytes < 0xf2eb8) {
      if (bytes < 0x3e3) {
        snprintf(formatted,0x18,"%d B");
        goto LAB_00110ebc;
      }
      dVar1 = (double)(long)bytes / 1000.0;
      __format = "%.1f KiB";
    }
    else {
      dVar1 = (double)(long)bytes / 1000000.0;
      __format = "%.1f MiB";
    }
  }
  else {
    auVar2._8_4_ = (int)(bytes >> 0x20);
    auVar2._0_8_ = bytes;
    auVar2._12_4_ = 0x45300000;
    dVar1 = ((auVar2._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)bytes) - 4503599627370496.0)) / 1000000000.0;
    __format = "%.1f GiB";
  }
  snprintf(formatted,0x18,__format,dVar1);
LAB_00110ebc:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,formatted,&local_49);
  commify(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string formatBytes (size_t bytes)
{
  char formatted[24];

       if (bytes >=  995000000) snprintf (formatted, sizeof(formatted), "%.1f GiB", bytes / 1000000000.0);
  else if (bytes >=     995000) snprintf (formatted, sizeof(formatted), "%.1f MiB", bytes /    1000000.0);
  else if (bytes >=        995) snprintf (formatted, sizeof(formatted), "%.1f KiB", bytes /       1000.0);
  else                          snprintf (formatted, sizeof(formatted), "%d B",     (int)bytes);

  return commify (formatted);
}